

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
WrappedBytes::hibernate<hiberlite::AVisitor<hiberlite::UpdateBean>>
          (WrappedBytes *this,AVisitor<hiberlite::UpdateBean> *ar)

{
  allocator local_b9;
  string local_b8 [55];
  allocator local_81;
  string local_80 [32];
  sql_nvp<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> local_60;
  AVisitor<hiberlite::UpdateBean> *local_18;
  AVisitor<hiberlite::UpdateBean> *ar_local;
  WrappedBytes *this_local;
  
  local_18 = ar;
  ar_local = (AVisitor<hiberlite::UpdateBean> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"bytes",&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"",&local_b9);
  hiberlite::sql_nvp<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::sql_nvp
            (&local_60,(string *)local_80,&this->bytes,(string *)local_b8);
  hiberlite::AVisitor<hiberlite::UpdateBean>::operator&(ar,&local_60);
  hiberlite::sql_nvp<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~sql_nvp
            (&local_60);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  return;
}

Assistant:

void hibernate(Archive & ar)
	{
  	  ar & HIBERLITE_NVP(bytes);
	}